

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_FormatNumber
              (RecyclableObject *function,CallInfo callInfo,...)

{
  int iVar1;
  int iVar2;
  ScriptContext *pSVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  BOOL BVar7;
  charcount_t cVar8;
  charcount_t cVar9;
  UNumberFormatFields field;
  undefined4 *puVar10;
  Var pvVar11;
  DynamicObject *pDVar12;
  JavascriptBoolean *pJVar13;
  Recycler *pRVar14;
  char16 *pcVar15;
  Recycler *pRVar16;
  LPCSTR pCVar17;
  JavascriptArray *pJVar18;
  JavascriptString *pJVar19;
  char16_t *pcVar20;
  char16_t *form;
  size_t sVar21;
  uint uVar22;
  uint in_stack_00000010;
  undefined1 local_a8 [8];
  NumberFormatPartsBuilder nfpb;
  Var pvStack_78;
  UErrorCode status;
  Var cachedUNumberFormat;
  undefined1 local_68 [8];
  Arguments args;
  int partEnd;
  double local_48;
  ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70> local_40;
  ScopedUFieldPositionIterator fpi;
  int partStart;
  
  pSVar3 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar3->threadContext,0xc00,pSVar3,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x958,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00b61de9;
    *puVar10 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  local_68 = (undefined1  [8])callInfo;
  if ((callInfo._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x958,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) goto LAB_00b61de9;
    *puVar10 = 0;
  }
  pSVar3 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_68 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x958,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar5) goto LAB_00b61de9;
    *puVar10 = 0;
  }
  if ((local_68._0_4_ & 0xffffff) == 5) {
    pvVar11 = Arguments::operator[]((Arguments *)local_68,1);
    if (((ulong)pvVar11 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar11 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) goto LAB_00b61de9;
      *puVar10 = 0;
    }
    if ((((ulong)pvVar11 & 0xffff000000000000) != 0x1000000000000) &&
       (pvVar11 = Arguments::operator[]((Arguments *)local_68,1), (ulong)pvVar11 >> 0x32 == 0))
    goto LAB_00b611b7;
    pvVar11 = Arguments::operator[]((Arguments *)local_68,2);
    bVar5 = DynamicObject::IsBaseDynamicObject(pvVar11);
    if (!bVar5) goto LAB_00b611b7;
    pvVar11 = Arguments::operator[]((Arguments *)local_68,3);
    bVar5 = VarIs<Js::JavascriptBoolean>(pvVar11);
    if (!bVar5) goto LAB_00b611b7;
    pvVar11 = Arguments::operator[]((Arguments *)local_68,4);
    bVar5 = VarIs<Js::JavascriptBoolean>(pvVar11);
    if (!bVar5) goto LAB_00b611b7;
  }
  else {
LAB_00b611b7:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x961,
                                "((args.Info.Count == 5 && (TaggedInt::Is(args[1]) || JavascriptNumber::Is(args[1])) && DynamicObject::IsBaseDynamicObject(args[2]) && VarIs<JavascriptBoolean>(args[3]) && VarIs<JavascriptBoolean>(args[4])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar5) goto LAB_00b61de9;
    *puVar10 = 0;
  }
  pvVar11 = Arguments::operator[]((Arguments *)local_68,1);
  if (((ulong)pvVar11 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar11 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar5) goto LAB_00b61de9;
    *puVar10 = 0;
  }
  if (((ulong)pvVar11 & 0xffff000000000000) == 0x1000000000000) {
    local_48 = (double)(int)pvVar11;
  }
  else if ((ulong)pvVar11 >> 0x32 == 0) {
    local_48 = JavascriptConversion::ToNumber_Full(pvVar11,pSVar3);
  }
  else {
    local_48 = (double)((ulong)pvVar11 ^ 0xfffc000000000000);
  }
  pvVar11 = Arguments::operator[]((Arguments *)local_68,2);
  pDVar12 = UnsafeVarTo<Js::DynamicObject>(pvVar11);
  pvVar11 = Arguments::operator[]((Arguments *)local_68,3);
  pJVar13 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar11);
  iVar1 = pJVar13->value;
  pvVar11 = Arguments::operator[]((Arguments *)local_68,4);
  pJVar13 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar11);
  iVar2 = pJVar13->value;
  pvStack_78 = (Var)0x0;
  iVar6 = (*(pDVar12->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x14])
                    (pDVar12,pDVar12,10,&stack0xffffffffffffff88,0,pSVar3);
  if (iVar6 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x968,
                                "(state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, __null, scriptContext))"
                                ,
                                "state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, __null, scriptContext)"
                               );
    if (!bVar5) goto LAB_00b61de9;
    *puVar10 = 0;
  }
  pcVar20 = L"%S(): Calling NumberFormat.prototype.formatToParts(%f)\n";
  if (iVar1 == 0) {
    pcVar20 = L"%S(): Calling NumberFormat.prototype.format(%f)\n";
  }
  form = L"%S(): Calling %f.toLocaleString(...)\n";
  if (iVar2 == 0) {
    form = pcVar20;
  }
  Output::Trace(IntlPhase,form,local_48,"EntryIntl_FormatNumber");
  cachedUNumberFormat = pvStack_78;
  if (iVar1 == 0) {
    pRVar16 = pSVar3->recycler;
    local_40.object = (UFieldPositionIterator *)((ulong)local_40.object._4_4_ << 0x20);
    local_a8 = (undefined1  [8])&char16_t::typeinfo;
    nfpb.num = 0.0;
    nfpb.formatted.ptr = (char16_t *)&DAT_00000008;
    nfpb._16_8_ = anon_var_dwarf_6708ef9;
    nfpb.sc.ptr._0_4_ = 0x159;
    pRVar14 = Memory::Recycler::TrackAllocInfo(pRVar16,(TrackAllocData *)local_a8);
    BVar7 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar5) goto LAB_00b61de9;
      *puVar10 = 0;
    }
    pcVar15 = (char16 *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                        (pRVar14,0x10);
    if (pcVar15 == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar5) goto LAB_00b61de9;
      *puVar10 = 0;
    }
    cVar8 = unum_formatDouble_70
                      (local_48,*(undefined8 *)((long)cachedUNumberFormat + 8),pcVar15,8,0,&local_40
                      );
    if ((int)cVar8 < 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15b,
                                  "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)"
                                  ,"allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0"
                                 );
      if (!bVar5) goto LAB_00b61de9;
      *puVar10 = 0;
    }
    if (((int)local_40.object == 0xf) || ((int)local_40.object == -0x7c)) {
      if ((int)cVar8 < 8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x15e,"(*returnLength >= firstTryLength)",
                                    "Executor reported buffer failure but did not require additional space"
                                   );
        if (!bVar5) goto LAB_00b61de9;
        *puVar10 = 0;
      }
      uVar22 = cVar8 + 1;
      Output::Trace(IntlPhase,
                    L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                    "EnsureBuffer",8,(ulong)uVar22);
      local_40.object = local_40.object & 0xffffffff00000000;
      local_a8 = (undefined1  [8])&char16_t::typeinfo;
      nfpb.num = 0.0;
      nfpb._16_8_ = anon_var_dwarf_6708ef9;
      nfpb.sc.ptr._0_4_ = 0x162;
      nfpb.formatted.ptr = (char16_t *)(long)(int)uVar22;
      pRVar16 = Memory::Recycler::TrackAllocInfo(pRVar16,(TrackAllocData *)local_a8);
      if (cVar8 == 0xffffffff) {
        Memory::Recycler::ClearTrackAllocInfo(pRVar16,(TrackAllocData *)0x0);
        pcVar15 = (char16 *)&DAT_00000008;
      }
      else {
        sVar21 = 0xffffffffffffffff;
        if (-1 < (int)uVar22) {
          sVar21 = (long)(int)uVar22 * 2;
        }
        BVar7 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar7 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                      "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar5) goto LAB_00b61de9;
          *puVar10 = 0;
        }
        pcVar15 = (char16 *)
                  Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                            (pRVar16,sVar21);
        if (pcVar15 == (char16 *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar5) goto LAB_00b61de9;
          *puVar10 = 0;
        }
      }
      cVar9 = unum_formatDouble_70
                        (local_48,*(undefined8 *)((long)cachedUNumberFormat + 8),pcVar15,uVar22,0,
                         &local_40);
      bVar5 = cVar9 != cVar8;
      cVar8 = cVar9;
      if (bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x164,"(*returnLength == secondTryLength - 1)",
                                    "Second try of executor returned unexpected length");
        goto joined_r0x00b61bb3;
      }
    }
    else if (7 < (int)cVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x168,"(*returnLength < firstTryLength)",
                                  "Executor required additional length but reported successful status"
                                 );
joined_r0x00b61bb3:
      if (!bVar5) goto LAB_00b61de9;
      *puVar10 = 0;
    }
    if ((int)local_40.object < 1 && (int)local_40.object != -0x7c) {
LAB_00b61dc5:
      pJVar19 = JavascriptString::NewWithBuffer(pcVar15,cVar8,pSVar3);
      return pJVar19;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    pCVar17 = (LPCSTR)u_errorName_70((ulong)local_40.object & 0xffffffff);
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar17);
    if (bVar5) {
      *puVar10 = 0;
      goto LAB_00b61dc5;
    }
    goto LAB_00b61de9;
  }
  nfpb.fields.ptr._4_4_ = 0;
  local_40.object = (UFieldPositionIterator *)ufieldpositer_open_70();
  pRVar16 = pSVar3->recycler;
  fpi.object._4_4_ = 0;
  local_a8 = (undefined1  [8])&char16_t::typeinfo;
  nfpb.num = 0.0;
  nfpb.formatted.ptr = (char16_t *)&DAT_00000008;
  nfpb._16_8_ = anon_var_dwarf_6708ef9;
  nfpb.sc.ptr._0_4_ = 0x159;
  pRVar14 = Memory::Recycler::TrackAllocInfo(pRVar16,(TrackAllocData *)local_a8);
  BVar7 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar7 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar5) goto LAB_00b61de9;
    *puVar10 = 0;
  }
  pcVar15 = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (pRVar14,0x10);
  if (pcVar15 == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar5) goto LAB_00b61de9;
    *puVar10 = 0;
  }
  cVar8 = unum_formatDoubleForFields_70
                    (local_48,*(undefined8 *)((long)cachedUNumberFormat + 8),pcVar15,8,
                     local_40.object,(undefined1 *)((long)&fpi.object + 4));
  if ((int)cVar8 < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x15b,
                                "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)",
                                "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0");
    if (!bVar5) goto LAB_00b61de9;
    *puVar10 = 0;
  }
  if ((fpi.object._4_4_ == 0xf) || (fpi.object._4_4_ == -0x7c)) {
    if ((int)cVar8 < 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15e,"(*returnLength >= firstTryLength)",
                                  "Executor reported buffer failure but did not require additional space"
                                 );
      if (!bVar5) goto LAB_00b61de9;
      *puVar10 = 0;
    }
    uVar22 = cVar8 + 1;
    Output::Trace(IntlPhase,
                  L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                  "EnsureBuffer",8,(ulong)uVar22);
    fpi.object._4_4_ = 0;
    local_a8 = (undefined1  [8])&char16_t::typeinfo;
    nfpb.num = 0.0;
    nfpb._16_8_ = anon_var_dwarf_6708ef9;
    nfpb.sc.ptr._0_4_ = 0x162;
    nfpb.formatted.ptr = (char16_t *)(long)(int)uVar22;
    pRVar16 = Memory::Recycler::TrackAllocInfo(pRVar16,(TrackAllocData *)local_a8);
    if (uVar22 == 0) {
      pcVar15 = (char16 *)&DAT_00000008;
      Memory::Recycler::ClearTrackAllocInfo(pRVar16,(TrackAllocData *)0x0);
    }
    else {
      sVar21 = 0xffffffffffffffff;
      if (-1 < (int)uVar22) {
        sVar21 = (long)(int)uVar22 * 2;
      }
      BVar7 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar7 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_00b61de9;
        *puVar10 = 0;
      }
      pcVar15 = (char16 *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                          (pRVar16,sVar21);
      if (pcVar15 == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) goto LAB_00b61de9;
        *puVar10 = 0;
      }
    }
    cVar9 = unum_formatDoubleForFields_70
                      (local_48,*(undefined8 *)((long)cachedUNumberFormat + 8),pcVar15,uVar22,
                       local_40.object,(undefined1 *)((long)&fpi.object + 4));
    bVar5 = cVar9 != cVar8;
    cVar8 = cVar9;
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x164,"(*returnLength == secondTryLength - 1)",
                                  "Second try of executor returned unexpected length");
      goto joined_r0x00b61a4f;
    }
  }
  else if (7 < (int)cVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x168,"(*returnLength < firstTryLength)",
                                "Executor required additional length but reported successful status"
                               );
joined_r0x00b61a4f:
    if (!bVar5) goto LAB_00b61de9;
    *puVar10 = 0;
  }
  if (0 < fpi.object._4_4_ || fpi.object._4_4_ == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    pCVar17 = (LPCSTR)u_errorName_70(fpi.object._4_4_);
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar17);
    if (!bVar5) {
LAB_00b61de9:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar10 = 0;
  }
  NumberFormatPartsBuilder::NumberFormatPartsBuilder
            ((NumberFormatPartsBuilder *)local_a8,local_48,pcVar15,cVar8,pSVar3);
  fpi.object._4_4_ = 0;
  args.Values._4_4_ = 0;
  field = ufieldpositer_next_70(local_40.object);
  while (-1 < (int)field) {
    NumberFormatPartsBuilder::InsertPart
              ((NumberFormatPartsBuilder *)local_a8,field,fpi.object._4_4_,args.Values._4_4_);
    field = ufieldpositer_next_70
                      (local_40.object,(undefined1 *)((long)&fpi.object + 4),
                       (undefined1 *)((long)&args.Values + 4));
  }
  pJVar18 = NumberFormatPartsBuilder::ToPartsArray((NumberFormatPartsBuilder *)local_a8);
  PlatformAgnostic::ICUHelpers::ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70>::
  ~ScopedICUObject(&local_40);
  return pJVar18;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_FormatNumber(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#if defined(INTL_ICU)
        INTL_CHECK_ARGS(
            args.Info.Count == 5 &&
            (TaggedInt::Is(args[1]) || JavascriptNumber::Is(args[1])) &&
            DynamicObject::IsBaseDynamicObject(args[2]) &&
            VarIs<JavascriptBoolean>(args[3]) &&
            VarIs<JavascriptBoolean>(args[4])
        );

        double num = JavascriptConversion::ToNumber(args[1], scriptContext);
        DynamicObject *state = UnsafeVarTo<DynamicObject>(args[2]);
        bool toParts = UnsafeVarTo<JavascriptBoolean>(args[3])->GetValue();
        bool forNumberPrototypeToLocaleString = UnsafeVarTo<JavascriptBoolean>(args[4])->GetValue();
        Var cachedUNumberFormat = nullptr; // cached by EntryIntl_CacheNumberFormat
        AssertOrFailFast(state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, NULL, scriptContext));

        if (forNumberPrototypeToLocaleString)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Number_Prototype_toLocaleString);
            INTL_TRACE("Calling %f.toLocaleString(...)", num);
        }
        else if (toParts)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(NumberFormat_Prototype_formatToParts);
            INTL_TRACE("Calling NumberFormat.prototype.formatToParts(%f)", num);
        }
        else
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(NumberFormat_Prototype_format);
            INTL_TRACE("Calling NumberFormat.prototype.format(%f)", num);
        }

        auto fmt = static_cast<FinalizableUNumberFormat *>(cachedUNumberFormat);
        char16 *formatted = nullptr;
        int formattedLen = 0;

        if (!toParts)
        {
            EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
            {
                return unum_formatDouble(*fmt, num, buf, bufLen, nullptr, status);
            }, scriptContext->GetRecycler(), &formatted, &formattedLen);

            return JavascriptString::NewWithBuffer(formatted, formattedLen, scriptContext);
        }

#if defined(ICU_VERSION) && ICU_VERSION >= 61
        UErrorCode status = U_ZERO_ERROR;
        ScopedUFieldPositionIterator fpi(ufieldpositer_open(&status));

        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return unum_formatDoubleForFields(*fmt, num, buf, bufLen, fpi, status);
        }, scriptContext->GetRecycler(), &formatted, &formattedLen);

        NumberFormatPartsBuilder nfpb(num, formatted, formattedLen, scriptContext);

        int partStart = 0;
        int partEnd = 0;
        int i = 0;
        for (int kind = ufieldpositer_next(fpi, &partStart, &partEnd); kind >= 0; kind = ufieldpositer_next(fpi, &partStart, &partEnd), ++i)
        {
            nfpb.InsertPart(static_cast<UNumberFormatFields>(kind), partStart, partEnd);
        }

        return nfpb.ToPartsArray();
#else
        JavascriptLibrary *library = scriptContext->GetLibrary();
        JavascriptArray *ret = library->CreateArray(1);
        DynamicObject* part = library->CreateObject();
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return unum_formatDouble(*fmt, num, buf, bufLen, nullptr, status);
        }, scriptContext->GetRecycler(), &formatted, &formattedLen);
        JavascriptOperators::InitProperty(part, PropertyIds::type, library->GetIntlUnknownPartString());
        JavascriptOperators::InitProperty(part, PropertyIds::value, JavascriptString::NewWithBuffer(formatted, formattedLen, scriptContext));

        ret->SetItem(0, part, PropertyOperationFlags::PropertyOperation_None);
        return ret;
#endif // #if ICU_VERSION >= 61 ... #else
#else
        INTL_CHECK_ARGS(
            args.Info.Count == 3 &&
            (TaggedInt::Is(args.Values[1]) || JavascriptNumber::Is(args.Values[1])) &&
            DynamicObject::IsBaseDynamicObject(args.Values[2])
        );

        DynamicObject *options = VarTo<DynamicObject>(args.Values[2]);
        Var hiddenObject = nullptr;
        AssertOrFailFastMsg(options->GetInternalProperty(options, Js::InternalPropertyIds::HiddenObject, &hiddenObject, NULL, scriptContext),
            "EntryIntl_FormatNumber: Could not retrieve hiddenObject.");
        DelayLoadWindowsGlobalization* wsl = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary();

        NumberFormatting::INumberFormatter *numberFormatter;
        numberFormatter = static_cast<NumberFormatting::INumberFormatter *>(((AutoCOMJSObject *)hiddenObject)->GetInstance());

        AutoHSTRING result;
        HRESULT hr;
        if (TaggedInt::Is(args.Values[1]))
        {
            IfFailThrowHr(numberFormatter->FormatInt(TaggedInt::ToInt32(args.Values[1]), &result));
        }
        else
        {
            IfFailThrowHr(numberFormatter->FormatDouble(JavascriptNumber::GetValue(args.Values[1]), &result));
        }

        PCWSTR strBuf = wsl->WindowsGetStringRawBuffer(*result, NULL);

        if (strBuf == nullptr)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
        else
        {
            JavascriptStringObject *retVal = scriptContext->GetLibrary()->CreateStringObject(Js::JavascriptString::NewCopySz(strBuf, scriptContext));
            return retVal;
        }
#endif
    }